

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  size_t sVar1;
  int iVar2;
  uchar *sha256sum;
  size_t sVar3;
  char *__dest;
  char *__haystack;
  bool local_b1;
  uchar *sha256sumdigest;
  char *end_pos;
  char *begin_pos;
  char *pinkeycopy;
  char *encoded;
  size_t pinkeylen;
  size_t encodedlen;
  CURLcode local_68;
  CURLcode encode;
  CURLcode result;
  CURLcode pem_read;
  size_t pem_len;
  size_t size;
  long filesize;
  uchar *pem_ptr;
  uchar *buf;
  FILE *fp;
  size_t pubkeylen_local;
  uchar *pubkey_local;
  char *pinnedpubkey_local;
  Curl_easy *data_local;
  
  pem_ptr = (uchar *)0x0;
  filesize = 0;
  local_68 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (pinnedpubkey == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else if ((pubkey == (uchar *)0x0) || (pubkeylen == 0)) {
    data_local._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  else {
    fp = (FILE *)pubkeylen;
    pubkeylen_local = (size_t)pubkey;
    pubkey_local = (uchar *)pinnedpubkey;
    pinnedpubkey_local = (char *)data;
    iVar2 = strncmp(pinnedpubkey,"sha256//",8);
    if (iVar2 == 0) {
      sha256sum = (uchar *)(*Curl_cmalloc)(0x20);
      if (sha256sum == (uchar *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_ossl_sha256sum((uchar *)pubkeylen_local,(size_t)fp,sha256sum,0x20);
        encodedlen._4_4_ =
             Curl_base64_encode((Curl_easy *)pinnedpubkey_local,(char *)sha256sum,0x20,&pinkeycopy,
                                &pinkeylen);
        (*Curl_cfree)(sha256sum);
        if (encodedlen._4_4_ == CURLE_OK) {
          Curl_infof((Curl_easy *)pinnedpubkey_local,"\t public key hash: sha256//%s\n",pinkeycopy);
          sVar3 = strlen((char *)pubkey_local);
          encoded = (char *)(sVar3 + 1);
          __dest = (char *)(*Curl_cmalloc)((size_t)encoded);
          if (__dest == (char *)0x0) {
            (*Curl_cfree)(pinkeycopy);
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,pubkey_local,(size_t)encoded);
            end_pos = __dest;
            do {
              __haystack = strstr(end_pos,";sha256//");
              sVar1 = pinkeylen;
              if (__haystack != (char *)0x0) {
                *__haystack = '\0';
              }
              sVar3 = strlen(end_pos + 8);
              if ((sVar1 == sVar3) && (iVar2 = memcmp(pinkeycopy,end_pos + 8,pinkeylen), iVar2 == 0)
                 ) {
                local_68 = CURLE_OK;
                break;
              }
              if (__haystack != (char *)0x0) {
                *__haystack = ';';
                end_pos = strstr(__haystack,"sha256//");
              }
              local_b1 = __haystack != (char *)0x0 && end_pos != (char *)0x0;
            } while (local_b1);
            (*Curl_cfree)(pinkeycopy);
            pinkeycopy = (char *)0x0;
            (*Curl_cfree)(__dest);
            data_local._4_4_ = local_68;
          }
        }
        else {
          data_local._4_4_ = encodedlen._4_4_;
        }
      }
    }
    else {
      buf = (uchar *)fopen64((char *)pubkey_local,"rb");
      if ((FILE *)buf == (FILE *)0x0) {
        data_local._4_4_ = local_68;
      }
      else {
        iVar2 = fseek((FILE *)buf,0,2);
        if (iVar2 == 0) {
          size = ftell((FILE *)buf);
          iVar2 = fseek((FILE *)buf,0,0);
          if (((((iVar2 == 0) && (-1 < (long)size)) && ((long)size < 0x100001)) &&
              ((pem_len = curlx_sotouz(size), fp <= pem_len &&
               (pem_ptr = (uchar *)(*Curl_cmalloc)((size_t)((long)&((FILE *)pem_len)->_flags + 1)),
               pem_ptr != (uchar *)0x0)))) &&
             (sVar3 = fread(pem_ptr,pem_len,1,(FILE *)buf), (int)sVar3 == 1)) {
            if (fp == (FILE *)pem_len) {
              iVar2 = memcmp((void *)pubkeylen_local,pem_ptr,(size_t)fp);
              if (iVar2 == 0) {
                local_68 = CURLE_OK;
              }
            }
            else {
              pem_ptr[pem_len] = '\0';
              encode = pubkey_pem_to_der((char *)pem_ptr,(uchar **)&filesize,(size_t *)&result);
              if (((encode == CURLE_OK) && (fp == _result)) &&
                 (iVar2 = memcmp((void *)pubkeylen_local,(void *)filesize,(size_t)fp), iVar2 == 0))
              {
                local_68 = CURLE_OK;
              }
            }
          }
        }
        (*Curl_cfree)(pem_ptr);
        pem_ptr = (uchar *)0x0;
        (*Curl_cfree)((void *)filesize);
        filesize = 0;
        fclose((FILE *)buf);
        data_local._4_4_ = local_68;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  FILE *fp;
  unsigned char *buf = NULL, *pem_ptr = NULL;
  long filesize;
  size_t size, pem_len;
  CURLcode pem_read;
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
#ifdef curlssl_sha256sum
  CURLcode encode;
  size_t encodedlen, pinkeylen;
  char *encoded, *pinkeycopy, *begin_pos, *end_pos;
  unsigned char *sha256sumdigest = NULL;
#endif

  /* if a path wasn't specified, don't pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(strncmp(pinnedpubkey, "sha256//", 8) == 0) {
#ifdef curlssl_sha256sum
    /* compute sha256sum of public key */
    sha256sumdigest = malloc(SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    curlssl_sha256sum(pubkey, pubkeylen,
                      sha256sumdigest, SHA256_DIGEST_LENGTH);
    encode = Curl_base64_encode(data, (char *)sha256sumdigest,
                                SHA256_DIGEST_LENGTH, &encoded, &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, "\t public key hash: sha256//%s\n", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeylen = strlen(pinnedpubkey) + 1;
    pinkeycopy = malloc(pinkeylen);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pinkeycopy, pinnedpubkey, pinkeylen);
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it'll go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
#else
    /* without sha256 support, this cannot match */
    (void)data;
#endif
    return result;
  }

  fp = fopen(pinnedpubkey, "rb");
  if(!fp)
    return result;

  do {
    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      break;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      break;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      break;

    /*
     * if the size of our certificate is bigger than the file
     * size then it can't match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      break;

    /*
     * Allocate buffer for the pinned key
     * With 1 additional byte for null terminator in case of PEM key
     */
    buf = malloc(size + 1);
    if(!buf)
      break;

    /* Returns number of elements read, which should be 1 */
    if((int) fread(buf, size, 1, fp) != 1)
      break;

    /* If the sizes are the same, it can't be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, buf, pubkeylen))
        result = CURLE_OK;
      break;
    }

    /*
     * Otherwise we will assume it's PEM and try to decode it
     * after placing null terminator
     */
    buf[size] = '\0';
    pem_read = pubkey_pem_to_der((const char *)buf, &pem_ptr, &pem_len);
    /* if it wasn't read successfully, exit */
    if(pem_read)
      break;

    /*
     * if the size of our certificate doesn't match the size of
     * the decoded file, they can't be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
  } while(0);

  Curl_safefree(buf);
  Curl_safefree(pem_ptr);
  fclose(fp);

  return result;
}